

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.h
# Opt level: O0

Expr * __thiscall
Program::makeExpr<CmpExpr,Expr*&,Expr*&,std::__cxx11::string&,bool>
          (Program *this,Expr **args,Expr **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,bool *args_3)

{
  Expr *this_00;
  unique_ptr<CmpExpr,_std::default_delete<CmpExpr>_> *in_RDI;
  Expr **in_R8;
  unique_ptr<Expr,_std::default_delete<Expr>_> *in_stack_ffffffffffffffb0;
  unique_ptr<Expr,_std::default_delete<Expr>_> *in_stack_ffffffffffffffb8;
  Program *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  unique_ptr<CmpExpr,_std::default_delete<CmpExpr>_> in_stack_ffffffffffffffd0;
  
  std::make_unique<CmpExpr,Expr*&,Expr*&,std::__cxx11::string&,bool>
            (in_R8,(Expr **)in_stack_ffffffffffffffd0._M_t.
                            super___uniq_ptr_impl<CmpExpr,_std::default_delete<CmpExpr>_>._M_t.
                            super__Tuple_impl<0UL,_CmpExpr_*,_std::default_delete<CmpExpr>_>.
                            super__Head_base<0UL,_CmpExpr_*,_false>._M_head_impl,
             in_stack_ffffffffffffffc8,(bool *)in_stack_ffffffffffffffc0);
  std::unique_ptr<Expr,std::default_delete<Expr>>::
  unique_ptr<CmpExpr,std::default_delete<CmpExpr>,void>
            (in_stack_ffffffffffffffb0,
             (unique_ptr<CmpExpr,_std::default_delete<CmpExpr>_> *)&stack0xffffffffffffffd0);
  this_00 = addOwnership(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::unique_ptr<Expr,_std::default_delete<Expr>_>::~unique_ptr
            ((unique_ptr<Expr,_std::default_delete<Expr>_> *)this_00);
  std::unique_ptr<CmpExpr,_std::default_delete<CmpExpr>_>::~unique_ptr(in_RDI);
  return this_00;
}

Assistant:

Expr* makeExpr(Args&&... args) {
        return addOwnership(std::make_unique<T>(std::forward<Args>(args)...));
    }